

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importPBRT.cpp
# Opt level: O1

SP __thiscall pbrt::importPBRT(pbrt *this,string *fileName,string *basePath)

{
  element_type *peVar1;
  element_type *this_00;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 this_01;
  undefined8 uVar5;
  int iVar6;
  runtime_error *this_02;
  long *plVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  element_type *peVar10;
  bool bVar11;
  SP SVar12;
  SP *scene;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  SP local_218;
  SP local_208;
  SP local_1f8;
  SP local_1e8;
  SP local_1d8;
  SP local_1c8;
  SP local_1b8;
  SP local_1a8;
  SP local_198;
  SP local_188;
  undefined1 local_178 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Texture>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
  local_158;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::LightSource>,_std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
  local_128;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Material>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Material>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>_>
  local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_c8;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Object>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  local_98;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Shape>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
  local_68;
  
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,".pbrt","");
  std::__cxx11::string::substr((ulong)local_178,(ulong)fileName);
  if (local_178._8_8_ == local_238._M_string_length) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp((void *)local_178._0_8_,local_238._M_dataplus._M_p,local_178._8_8_);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,
                    (ulong)((long)&((__shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_178._16_8_)->_M_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (!bVar11) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_238,"could not detect input file format!? (unknown extension in \'",
                   fileName);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_178._0_8_ = *plVar7;
    peVar8 = (element_type *)(plVar7 + 2);
    if ((element_type *)local_178._0_8_ == peVar8) {
      local_178._16_8_ = ((Entity *)&peVar8->_vptr_Scene)->_vptr_Entity;
      _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
      local_178._0_8_ = (element_type *)(local_178 + 0x10);
    }
    else {
      local_178._16_8_ = ((Entity *)&peVar8->_vptr_Scene)->_vptr_Entity;
    }
    local_178._8_8_ = plVar7[1];
    *plVar7 = (long)peVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(this_02,(string *)local_178);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  syntactic::Scene::parse((Scene *)local_178,fileName,basePath);
  this_01 = local_178._8_8_;
  uVar3 = local_178._0_8_;
  local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178._0_8_ = (element_type *)0x0;
  local_188.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_188.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
    }
  }
  SemanticParser::SemanticParser((SemanticParser *)local_178,&local_188);
  uVar5 = local_178._8_8_;
  uVar4 = local_178._0_8_;
  *(undefined8 *)this = local_178._0_8_;
  *(undefined8 *)(this + 8) = 0;
  local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)(this + 8) = uVar5;
  local_178._0_8_ = (element_type *)0x0;
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Shape>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
  ::~_Rb_tree(&local_68);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Object>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_c8);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Material>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Material>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>_>
  ::~_Rb_tree(&local_f8);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::LightSource>,_std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
  ::~_Rb_tree(&local_128);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Texture>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::~_Rb_tree(&local_158);
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  if (local_188.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_198.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  local_198.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
    }
  }
  local_1a8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_1a8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
    }
  }
  createFilm(&local_198,&local_1a8);
  if (local_1a8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_198.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1c8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_1c8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
    }
  }
  createSampler(&local_1b8,&local_1c8);
  if (local_1c8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1e8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_1e8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
    }
  }
  createIntegrator(&local_1d8,&local_1e8);
  if (local_1e8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_208.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_208.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_01 + 8) = *(_Atomic_word *)(this_01 + 8) + 1;
    }
  }
  createPixelFilter(&local_1f8,&local_208);
  _Var9._M_pi = extraout_RDX;
  if (local_208.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_01;
  }
  peVar10 = (element_type *)
            (((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
               *)(uVar3 + 8))->
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (element_type *)
           ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
           &(((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
               *)(uVar3 + 8))->
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
            )._M_impl.super__Vector_impl_data._M_finish)->_M_pi;
  if (peVar10 != peVar1) {
    do {
      local_218.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar10->_vptr_Entity;
      this_00 = (peVar10->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
               *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
          UNLOCK();
        }
        else {
          *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
               *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
        }
      }
      lVar2 = *(long *)this;
      if (this_00 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
               *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
          UNLOCK();
        }
        else {
          *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
               *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
        }
      }
      local_218.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      createCamera((pbrt *)local_178,&local_218);
      std::vector<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>>::
      emplace_back<std::shared_ptr<pbrt::Camera>>
                ((vector<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>>
                  *)(lVar2 + 0x18),(shared_ptr<pbrt::Camera> *)local_178);
      _Var9._M_pi = extraout_RDX_02;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
        _Var9._M_pi = extraout_RDX_03;
      }
      if ((element_type *)
          local_218.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_04;
      }
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        _Var9._M_pi = extraout_RDX_05;
      }
      peVar10 = (element_type *)
                &(peVar10->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    } while (peVar10 != peVar1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    _Var9._M_pi = extraout_RDX_06;
  }
  SVar12.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi
  ;
  SVar12.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar12.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Scene::SP importPBRT(const std::string &fileName, const std::string &basePath)
  {
    pbrt::syntactic::Scene::SP pbrt;
    if (endsWith(fileName,".pbrt"))
      pbrt = pbrt::syntactic::Scene::parse(fileName, basePath);
    else
      throw std::runtime_error("could not detect input file format!? (unknown extension in '"+fileName+"')");
      
    Scene::SP scene = SemanticParser(pbrt).result;
    createFilm(scene,pbrt);
    createSampler(scene,pbrt);
    createIntegrator(scene,pbrt);
    createPixelFilter(scene,pbrt);
    for (auto cam : pbrt->cameras)
      scene->cameras.push_back(createCamera(cam));
    return scene;
  }